

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FileOptions * __thiscall
google::protobuf::FileDescriptorProto::mutable_options(FileDescriptorProto *this)

{
  uint32_t *puVar1;
  FileOptions *pFVar2;
  FileOptions *_msg;
  FileDescriptorProto *this_local;
  
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 8;
  pFVar2 = _internal_mutable_options(this);
  return pFVar2;
}

Assistant:

inline ::google::protobuf::FileOptions* PROTOBUF_NONNULL FileDescriptorProto::mutable_options()
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  _impl_._has_bits_[0] |= 0x00000008u;
  ::google::protobuf::FileOptions* _msg = _internal_mutable_options();
  // @@protoc_insertion_point(field_mutable:google.protobuf.FileDescriptorProto.options)
  return _msg;
}